

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointcheckpointscheme.c
# Opt level: O0

SUNErrCode
SUNAdjointCheckpointScheme_LoadVector
          (SUNAdjointCheckpointScheme_conflict self,suncountertype step_num,suncountertype stage_num
          ,int peek,N_Vector *out,sunrealtype *tout)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  SUNErrCode err;
  SUNContext sunctx_local_scope_;
  undefined4 local_4;
  
  if (*(long *)(*in_RDI + 0x10) == 0) {
    local_4 = -0x2701;
  }
  else {
    local_4 = (**(code **)(*in_RDI + 0x10))(in_RDI,in_RSI,in_RDX,in_ECX,in_R8,in_R9);
  }
  return local_4;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_LoadVector(SUNAdjointCheckpointScheme self,
                                                 suncountertype step_num,
                                                 suncountertype stage_num,
                                                 sunbooleantype peek,
                                                 N_Vector* out, sunrealtype* tout)
{
  SUNFunctionBegin(self->sunctx);
  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);
  if (self->ops->loadvector)
  {
    SUNErrCode err = self->ops->loadvector(self, step_num, stage_num, peek, out,
                                           tout);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }
  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}